

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcControllerType::~IfcControllerType(IfcControllerType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionControlElementType).
                              super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1c0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1c0) = 0x872838;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x872978;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x872860;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x872888;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8728b0;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x8728d8;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x872900;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x872928;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x872950;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x872dd8;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x70 = 0x872ea0;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x872e00;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x872e28;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x872e50;
  *(undefined8 *)&this_00->field_0x148 = 0x872e78;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__008729a8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcControllerType() : Object("IfcControllerType") {}